

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

SectionHdrWrapper * __thiscall
PEFile::addNewSection(PEFile *this,QString *name,bufsize_t r_size,bufsize_t v_size)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *__src;
  long lVar6;
  undefined8 local_250;
  undefined4 local_240;
  anon_union_4_2_d8da8690_for_Misc local_238;
  size_t local_228;
  long local_218;
  undefined1 local_1b8 [8];
  SectionHdrWrapper wr;
  size_t copySize;
  size_t bufSize;
  size_t nameLen;
  IMAGE_SECTION_HEADER secHdr;
  ExeNodeWrapper *sec;
  WatchedLocker lock_1;
  bufsize_t newVirtualSize;
  undefined1 local_88 [8];
  WatchedLocker lock;
  SectionHdrWrapper *secHdrWr;
  bufsize_t roundedVirtualEnd;
  bufsize_t roundedRawEnd;
  bufsize_t newSize;
  bufsize_t v_size_local;
  bufsize_t r_size_local;
  QString *name_local;
  PEFile *this_local;
  
  if ((r_size == 0) && (v_size == 0)) {
    this_local = (PEFile *)0x0;
  }
  else {
    roundedRawEnd = 0;
    roundedVirtualEnd = 0;
    secHdrWr = (SectionHdrWrapper *)0x0;
    lock.showLock = false;
    lock._49_7_ = 0;
    WatchedLocker::WatchedLocker((WatchedLocker *)local_88,&this->m_peMutex,false,"addNewSection");
    bVar2 = _canAddNewSection(this);
    newSize = v_size;
    if (bVar2) {
      if (v_size == 0) {
        newSize = r_size;
      }
      iVar5 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,1);
      iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,1);
      roundedVirtualEnd =
           buf_util::roundupToUnit(CONCAT44(extraout_var,iVar5),CONCAT44(extraout_var_00,iVar3));
      iVar5 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,2);
      iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x10])(this,2);
      secHdrWr = (SectionHdrWrapper *)
                 buf_util::roundupToUnit
                           (CONCAT44(extraout_var_01,iVar5),CONCAT44(extraout_var_02,iVar3));
      roundedRawEnd = roundedVirtualEnd + r_size;
      lock_1._48_8_ =
           (long)&(secHdrWr->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                  super_AbstractByteBuffer._vptr_AbstractByteBuffer + newSize;
      bVar2 = setVirtualSize(this,lock_1._48_8_);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        Logger::append(D_ERROR,"Failed to change virtual size to: %X",lock_1._48_8_);
        this_local = (PEFile *)0x0;
        bVar2 = true;
      }
    }
    else {
      this_local = (PEFile *)0x0;
      bVar2 = true;
    }
    WatchedLocker::~WatchedLocker((WatchedLocker *)local_88);
    if (!bVar2) {
      uVar4 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[10])(this,roundedRawEnd);
      if ((uVar4 & 1) == 0) {
        Logger::append(D_ERROR,"Failed to resize");
        this_local = (PEFile *)0x0;
      }
      else {
        WatchedLocker::WatchedLocker((WatchedLocker *)&sec,&this->m_peMutex,false,"addNewSection");
        iVar5 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                          (&(this->super_MappedExe).super_ExeWrappersContainer,5);
        if (CONCAT44(extraout_var_03,iVar5) == 0) {
          local_218 = 0;
        }
        else {
          local_218 = __dynamic_cast(CONCAT44(extraout_var_03,iVar5),&ExeElementWrapper::typeinfo,
                                     &ExeNodeWrapper::typeinfo,0);
        }
        secHdr.NumberOfRelocations = (undefined2)local_218;
        secHdr.NumberOfLinenumbers = local_218._2_2_;
        secHdr.Characteristics = local_218._4_4_;
        if (local_218 == 0) {
          this_local = (PEFile *)0x0;
          bVar2 = true;
        }
        else {
          secHdr.Misc = (anon_union_4_2_d8da8690_for_Misc)0x0;
          secHdr.VirtualAddress = 0;
          secHdr.SizeOfRawData = 0;
          secHdr.PointerToRawData = 0;
          nameLen = 0;
          secHdr.Name[0] = '\0';
          secHdr.Name[1] = '\0';
          secHdr.Name[2] = '\0';
          secHdr.Name[3] = '\0';
          secHdr.Name[4] = '\0';
          secHdr.Name[5] = '\0';
          secHdr.Name[6] = '\0';
          secHdr.Name[7] = '\0';
          secHdr.PointerToRelocations = 0;
          secHdr.PointerToLinenumbers = 0;
          local_228 = QString::length(name);
          if (7 < local_228) {
            local_228 = 8;
          }
          if (local_228 != 0) {
            QString::toStdString_abi_cxx11_((string *)&wr.header,name);
            __src = (void *)std::__cxx11::string::c_str();
            memcpy(&nameLen,__src,local_228);
            std::__cxx11::string::~string((string *)&wr.header);
          }
          uVar1 = SUB84(secHdrWr,0);
          if (r_size < 0xffffffff) {
            local_238.PhysicalAddress = (DWORD)r_size;
          }
          else {
            local_238.PhysicalAddress = 0xffffffff;
          }
          secHdr.VirtualAddress = (DWORD)roundedVirtualEnd;
          secHdr.Misc.PhysicalAddress = local_238.PhysicalAddress;
          if (newSize < 0xffffffff) {
            local_240 = (undefined4)newSize;
          }
          else {
            local_240 = 0xffffffff;
          }
          secHdr.Name[4] = (char)uVar1;
          secHdr.Name[5] = (char)((uint)uVar1 >> 8);
          secHdr.Name[6] = (char)((uint)uVar1 >> 0x10);
          secHdr.Name[7] = (char)((uint)uVar1 >> 0x18);
          secHdr.Name[0] = (undefined1)local_240;
          secHdr.Name[1] = local_240._1_1_;
          secHdr.Name[2] = local_240._2_1_;
          secHdr.Name[3] = local_240._3_1_;
          SectionHdrWrapper::SectionHdrWrapper
                    ((SectionHdrWrapper *)local_1b8,this,(IMAGE_SECTION_HEADER *)&nameLen);
          lVar6 = (**(code **)(*(long *)secHdr._32_8_ + 0x140))(secHdr._32_8_,local_1b8);
          if (lVar6 == 0) {
            local_250._0_1_ = false;
            local_250._1_7_ = 0;
          }
          else {
            local_250 = __dynamic_cast(lVar6,&ExeNodeWrapper::typeinfo,&SectionHdrWrapper::typeinfo,
                                       0);
          }
          lock.showLock = local_250._0_1_;
          lock._49_7_ = local_250._1_7_;
          SectionHdrWrapper::~SectionHdrWrapper((SectionHdrWrapper *)local_1b8);
          bVar2 = false;
        }
        WatchedLocker::~WatchedLocker((WatchedLocker *)&sec);
        if (!bVar2) {
          this_local = (PEFile *)lock._48_8_;
        }
      }
    }
  }
  return (SectionHdrWrapper *)this_local;
}

Assistant:

SectionHdrWrapper* PEFile::addNewSection(QString name, bufsize_t r_size, bufsize_t v_size)
{
    if (!r_size && !v_size) return nullptr; //nothing to add
    
    bufsize_t newSize = 0;
    bufsize_t roundedRawEnd = 0;
    bufsize_t roundedVirtualEnd = 0;
    SectionHdrWrapper* secHdrWr = nullptr;
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        if (!_canAddNewSection()) {
            return nullptr;
        }

        if (!v_size) {
            v_size = r_size;
        }
        roundedRawEnd = buf_util::roundupToUnit(getMappedSize(Executable::RAW), getAlignment(Executable::RAW));
        roundedVirtualEnd = buf_util::roundupToUnit(getMappedSize(Executable::RVA), getAlignment(Executable::RVA));
        newSize = roundedRawEnd + r_size;
        const bufsize_t newVirtualSize = roundedVirtualEnd + v_size;
        if (setVirtualSize(newVirtualSize) == false) {
            Logger::append(Logger::D_ERROR, "Failed to change virtual size to: %X", newVirtualSize);
            return nullptr;
        }
    } //scope0
    
    // the PE file is resized and rewrapped:
    if (resize(newSize) == false) {
        Logger::append(Logger::D_ERROR, "Failed to resize");
        return nullptr;
    }
    
    { //scope1
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        // fetch again after resize:
        ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
        if (!sec) {
            return nullptr;
        }

        IMAGE_SECTION_HEADER secHdr;
        ::memset(&secHdr, 0, sizeof(IMAGE_SECTION_HEADER));

        //name copy:
        const size_t nameLen = name.length();
        const size_t bufSize = sizeof(secHdr.Name);
        const size_t copySize = (nameLen < bufSize) ? nameLen : bufSize;
        if (copySize) {
            ::memcpy(secHdr.Name, name.toStdString().c_str(), copySize);
        }
        secHdr.PointerToRawData = static_cast<DWORD>(roundedRawEnd);
        secHdr.VirtualAddress = static_cast<DWORD>(roundedVirtualEnd);
        secHdr.SizeOfRawData = MASK_TO_DWORD(r_size);
        secHdr.Misc.VirtualSize = MASK_TO_DWORD(v_size);

        SectionHdrWrapper wr(this, &secHdr);
        secHdrWr = dynamic_cast<SectionHdrWrapper*>(sec->addEntry(&wr));
    } //!scope1
    return secHdrWr;
}